

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O0

int ngp_unread_line(void)

{
  int local_4;
  
  if (ngp_curline.line == (char *)0x0) {
    local_4 = 0x16b;
  }
  else if (ngp_prevline.line == (char *)0x0) {
    memcpy(&ngp_prevline,&ngp_curline,0x30);
    ngp_curline.line = (char *)0x0;
    local_4 = 0;
  }
  else {
    local_4 = 0x16c;
  }
  return local_4;
}

Assistant:

int	ngp_unread_line(void)
 {
   if (NULL == ngp_curline.line)		/* nothing to unread */
     return(NGP_EMPTY_CURLINE);

   if (NULL != ngp_prevline.line)		/* we cannot unread line twice */
     return(NGP_UNREAD_QUEUE_FULL);

   ngp_prevline = ngp_curline;
   ngp_curline.line = NULL;
   return(NGP_OK);
 }